

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

float Abc_NtkComputeEdgeDept(Abc_Obj_t *pFanout,int iFanin,float Slew)

{
  SC_Cell *pCell;
  SC_Timing *pTime;
  float fVar1;
  float fVar2;
  SC_Pair SlewOut;
  SC_Pair ArrOut;
  SC_Pair ArrIn;
  SC_Pair LoadIn;
  SC_Pair local_58;
  SC_Pair local_50;
  SC_Pair local_48;
  SC_Pair local_40;
  SC_Pair local_38;
  
  fVar1 = Bus_SclObjLoad(pFanout);
  fVar2 = Bus_SclObjDept(pFanout);
  pCell = Abc_SclObjCell(pFanout);
  local_48.rise = 0.0;
  local_48.fall = 0.0;
  local_50.rise = 0.0;
  local_50.fall = 0.0;
  local_58.rise = 0.0;
  local_58.fall = 0.0;
  local_40.rise = Slew;
  local_40.fall = Slew;
  local_38.rise = fVar1;
  local_38.fall = fVar1;
  pTime = Scl_CellPinTime(pCell,iFanin);
  Scl_LibPinArrival(pTime,&local_48,&local_40,&local_38,&local_50,&local_58);
  fVar1 = local_50.fall * 0.5 + local_50.rise * 0.5;
  if (0.0 < fVar1) {
    return fVar2 + fVar1;
  }
  __assert_fail("Edge > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                ,0xaf,"float Abc_NtkComputeEdgeDept(Abc_Obj_t *, int, float)");
}

Assistant:

static inline float Abc_NtkComputeEdgeDept( Abc_Obj_t * pFanout, int iFanin, float Slew )
{
    float Load = Bus_SclObjLoad( pFanout );
    float Dept = Bus_SclObjDept( pFanout );
    float Edge = Scl_LibPinArrivalEstimate( Abc_SclObjCell(pFanout), iFanin, Slew, Load );
    assert( Edge > 0 );
    return Dept + Edge;
}